

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNormalizer.cpp
# Opt level: O3

void __thiscall xercesc_4_0::DOMNormalizer::namespaceFixUp(DOMNormalizer *this,DOMElementImpl *ele)

{
  short sVar1;
  short sVar2;
  DOMAttrMapImpl *pDVar3;
  BaseRefVectorOf<xercesc_4_0::DOMNormalizer::InScopeNamespaces::Scope> *pBVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined2 *puVar9;
  XMLCh *pXVar10;
  short *psVar11;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  DOMNode *node;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  long lVar12;
  undefined4 extraout_var_08;
  Scope *pSVar13;
  XMLCh *pXVar14;
  short *psVar15;
  MemoryManager *pMVar16;
  XMLCh *pXVar17;
  InScopeNamespaces *pIVar18;
  long lVar19;
  long *plVar8;
  undefined4 extraout_var_05;
  
  pDVar3 = ele->fAttributes;
  iVar6 = (*(pDVar3->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[5])(pDVar3);
  if (CONCAT44(extraout_var,iVar6) != 0) {
    lVar19 = 0;
    do {
      iVar7 = (*(pDVar3->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[3])(pDVar3,lVar19);
      plVar8 = (long *)CONCAT44(extraout_var_00,iVar7);
      (**(code **)(*plVar8 + 0xa0))(plVar8);
      puVar9 = (undefined2 *)(**(code **)(*plVar8 + 0xb0))(plVar8);
      pXVar10 = (XMLCh *)(**(code **)(*plVar8 + 0x18))(plVar8);
      if (puVar9 == &XMLUni::fgXMLNSURIName) {
LAB_0027454a:
        if (pXVar10 == L"http://www.w3.org/2000/xmlns/") {
LAB_0027461f:
          error(this,NSDeclInvalid,(DOMNode *)ele);
        }
        else {
          if (pXVar10 != (XMLCh *)0x0) {
            lVar12 = 0;
            do {
              psVar11 = (short *)((long)&XMLUni::fgXMLNSURIName + lVar12);
              if (*psVar11 == 0) {
                if (*(short *)((long)pXVar10 + lVar12) == 0) goto LAB_0027461f;
                break;
              }
              psVar15 = (short *)((long)pXVar10 + lVar12);
              lVar12 = lVar12 + 2;
            } while (*psVar11 == *psVar15);
          }
          psVar11 = (short *)(**(code **)(*plVar8 + 0xb8))(plVar8);
          if (psVar11 == &XMLUni::fgXMLNSString) {
LAB_002745dd:
            pIVar18 = this->fNSScope;
            pXVar17 = (XMLCh *)(**(code **)(*plVar8 + 0xc0))(plVar8);
            pMVar16 = this->fMemoryManager;
          }
          else {
            psVar15 = &XMLUni::fgXMLNSString;
            if (psVar11 == (short *)0x0) {
LAB_002745c1:
              if (*psVar15 == 0) goto LAB_002745dd;
            }
            else {
              psVar15 = &XMLUni::fgXMLNSString;
              do {
                sVar1 = *psVar11;
                if (sVar1 == 0) goto LAB_002745c1;
                psVar11 = psVar11 + 1;
                sVar2 = *psVar15;
                psVar15 = psVar15 + 1;
              } while (sVar1 == sVar2);
            }
            pIVar18 = this->fNSScope;
            pMVar16 = this->fMemoryManager;
            pXVar17 = L"";
          }
          InScopeNamespaces::addOrChangeBinding(pIVar18,pXVar17,pXVar10,pMVar16);
        }
      }
      else if (puVar9 != (undefined2 *)0x0) {
        lVar12 = 0;
        do {
          psVar11 = (short *)((long)&XMLUni::fgXMLNSURIName + lVar12);
          if (*psVar11 == 0) {
            if (*(short *)((long)puVar9 + lVar12) == 0) goto LAB_0027454a;
            break;
          }
          psVar15 = (short *)((long)puVar9 + lVar12);
          lVar12 = lVar12 + 2;
        } while (*psVar11 == *psVar15);
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != CONCAT44(extraout_var,iVar6));
  }
  iVar6 = (*(ele->super_DOMElement).super_DOMNode._vptr_DOMNode[0x17])(ele);
  pXVar10 = (XMLCh *)CONCAT44(extraout_var_01,iVar6);
  if (pXVar10 == (XMLCh *)0x0) {
    pXVar10 = L"";
  }
  iVar6 = (*(ele->super_DOMElement).super_DOMNode._vptr_DOMNode[0x16])(ele);
  pXVar17 = (XMLCh *)CONCAT44(extraout_var_02,iVar6);
  if (pXVar17 == L"" || pXVar17 == (XMLCh *)0x0) {
LAB_00274684:
    iVar6 = (*(ele->super_DOMElement).super_DOMNode._vptr_DOMNode[0x18])(ele);
    if (CONCAT44(extraout_var_03,iVar6) == 0) {
      error(this,DOMLevel1Node,(DOMNode *)ele);
      goto LAB_0027476a;
    }
    bVar5 = InScopeNamespaces::isValidBinding(this->fNSScope,L"",L"");
    if (bVar5) goto LAB_0027476a;
    (*(ele->super_DOMElement).super_DOMNode._vptr_DOMNode[0x31])
              (ele,&XMLUni::fgXMLNSURIName,&XMLUni::fgXMLNSString,&XMLUni::fgZeroLenString);
    pIVar18 = this->fNSScope;
    pMVar16 = this->fMemoryManager;
    pXVar10 = L"";
    pXVar17 = L"";
  }
  else {
    lVar19 = 0;
    do {
      psVar11 = (short *)((long)pXVar17 + lVar19);
      if (*psVar11 == 0) {
        if (*(short *)((long)&XMLUni::fgZeroLenString + lVar19) == 0) goto LAB_00274684;
        break;
      }
      psVar15 = (short *)((long)&XMLUni::fgZeroLenString + lVar19);
      lVar19 = lVar19 + 2;
    } while (*psVar11 == *psVar15);
    bVar5 = InScopeNamespaces::isValidBinding(this->fNSScope,pXVar10,pXVar17);
    if (bVar5) goto LAB_0027476a;
    addOrChangeNamespaceDecl(this,pXVar10,pXVar17,ele);
    pIVar18 = this->fNSScope;
    pMVar16 = this->fMemoryManager;
  }
  InScopeNamespaces::addOrChangeBinding(pIVar18,pXVar10,pXVar17,pMVar16);
LAB_0027476a:
  iVar6 = (*(pDVar3->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[5])(pDVar3);
  if (CONCAT44(extraout_var_04,iVar6) != 0) {
    lVar19 = 0;
    do {
      iVar7 = (*(pDVar3->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[3])(pDVar3,lVar19);
      node = (DOMNode *)CONCAT44(extraout_var_05,iVar7);
      iVar7 = (*node->_vptr_DOMNode[0x16])(node);
      pXVar10 = (XMLCh *)CONCAT44(extraout_var_06,iVar7);
      iVar7 = (*node->_vptr_DOMNode[0x17])(node);
      pXVar17 = (XMLCh *)CONCAT44(extraout_var_07,iVar7);
      if (pXVar10 != L"http://www.w3.org/2000/xmlns/") {
        if (pXVar10 == (XMLCh *)0x0) {
          iVar7 = (*node->_vptr_DOMNode[0x18])(node);
          if (CONCAT44(extraout_var_08,iVar7) == 0) {
            error(this,DOMLevel1Node,node);
          }
        }
        else {
          lVar12 = 0;
          do {
            psVar11 = (short *)((long)&XMLUni::fgXMLNSURIName + lVar12);
            if (*psVar11 == 0) {
              if (*(short *)((long)pXVar10 + lVar12) == 0) goto LAB_0027491a;
              break;
            }
            psVar15 = (short *)((long)pXVar10 + lVar12);
            lVar12 = lVar12 + 2;
          } while (*psVar11 == *psVar15);
          if ((pXVar17 == (XMLCh *)0x0) ||
             (bVar5 = InScopeNamespaces::isValidBinding(this->fNSScope,pXVar17,pXVar10), !bVar5)) {
            pBVar4 = &this->fNSScope->fScopes->
                      super_BaseRefVectorOf<xercesc_4_0::DOMNormalizer::InScopeNamespaces::Scope>;
            pSVar13 = BaseRefVectorOf<xercesc_4_0::DOMNormalizer::InScopeNamespaces::Scope>::
                      elementAt(pBVar4,pBVar4->fCurCount - 1);
            pXVar14 = InScopeNamespaces::Scope::getPrefix(pSVar13,pXVar10);
            if (pXVar14 == (XMLCh *)0x0) {
              if (pXVar17 != (XMLCh *)0x0) {
                pBVar4 = &this->fNSScope->fScopes->
                          super_BaseRefVectorOf<xercesc_4_0::DOMNormalizer::InScopeNamespaces::Scope>
                ;
                pSVar13 = BaseRefVectorOf<xercesc_4_0::DOMNormalizer::InScopeNamespaces::Scope>::
                          elementAt(pBVar4,pBVar4->fCurCount - 1);
                pXVar14 = InScopeNamespaces::Scope::getUri(pSVar13,pXVar17);
                if (pXVar14 == (XMLCh *)0x0) {
                  InScopeNamespaces::addOrChangeBinding
                            (this->fNSScope,pXVar17,pXVar10,this->fMemoryManager);
                  addOrChangeNamespaceDecl(this,pXVar17,pXVar10,ele);
                  goto LAB_0027491a;
                }
              }
              pXVar17 = addCustomNamespaceDecl(this,pXVar10,ele);
              InScopeNamespaces::addOrChangeBinding
                        (this->fNSScope,pXVar17,pXVar10,this->fMemoryManager);
              (*node->_vptr_DOMNode[0x19])(node,pXVar17);
            }
            else {
              (*node->_vptr_DOMNode[0x19])(node,pXVar14);
            }
          }
        }
      }
LAB_0027491a:
      lVar19 = lVar19 + 1;
    } while (lVar19 != CONCAT44(extraout_var_04,iVar6));
  }
  return;
}

Assistant:

void DOMNormalizer::namespaceFixUp(DOMElementImpl *ele) const {
    DOMAttrMapImpl *attrMap = ele->fAttributes;

    XMLSize_t len = attrMap->getLength();
    //get the ns info from the attrs
    for(XMLSize_t i = 0; i < len; i++) {
        DOMAttr *at = (DOMAttr*)attrMap->item(i);

        //normalize the attr whatever happens
        at->normalize();

        const XMLCh *uri = at->getNamespaceURI();
        const XMLCh *value = at->getNodeValue();

        if(XMLString::equals(XMLUni::fgXMLNSURIName, uri)) {
            if(XMLString::equals(XMLUni::fgXMLNSURIName, value)) {
                error(XMLErrs::NSDeclInvalid, ele);
            }
            else {
                const XMLCh *prefix = at->getPrefix();

                if(XMLString::equals(prefix, XMLUni::fgXMLNSString)) {
                    fNSScope->addOrChangeBinding(at->getLocalName(), value, fMemoryManager);
                }
                else {
                    fNSScope->addOrChangeBinding(XMLUni::fgZeroLenString, value, fMemoryManager);
                }
            }
        }
    }

    const XMLCh* prefix = ele->getPrefix();
    prefix ? prefix : prefix = XMLUni::fgZeroLenString;
    const XMLCh* uri = ele->getNamespaceURI();
    uri ? uri : uri = XMLUni::fgZeroLenString;

    if(!XMLString::equals(uri, XMLUni::fgZeroLenString)) {
        if(!fNSScope->isValidBinding(prefix, uri)) {
            addOrChangeNamespaceDecl(prefix, uri, ele);
            fNSScope->addOrChangeBinding(prefix, uri, fMemoryManager);
        }
    }
    else {
        if(ele->getLocalName() == 0) {
            error(XMLErrs::DOMLevel1Node, ele);
        }
        else if(!fNSScope->isValidBinding(XMLUni::fgZeroLenString, XMLUni::fgZeroLenString)) {
            addOrChangeNamespaceDecl(XMLUni::fgZeroLenString, XMLUni::fgZeroLenString, ele);
            fNSScope->addOrChangeBinding(XMLUni::fgZeroLenString, XMLUni::fgZeroLenString, fMemoryManager);
        }
    }

    //fix up non ns attrs
    len = attrMap->getLength();

    // hp aCC complains this i is a redefinition of the i on line 283
    for(XMLSize_t j = 0; j < len; j++) {
        DOMAttr *at = (DOMAttr*)attrMap->item(j);
        const XMLCh *uri = at->getNamespaceURI();
        const XMLCh* prefix = at->getPrefix();

        if(!XMLString::equals(XMLUni::fgXMLNSURIName, uri)) {
            if(uri != 0) {
                if(prefix == 0 || !fNSScope->isValidBinding(prefix, uri)) {

                    const XMLCh* newPrefix =  fNSScope->getPrefix(uri);

                    if(newPrefix != 0) {
                        at->setPrefix(newPrefix);
                    }
                    else {
                        if(prefix != 0 && !fNSScope->getUri(prefix)) {
                            fNSScope->addOrChangeBinding(prefix, uri, fMemoryManager);
                            addOrChangeNamespaceDecl(prefix, uri, ele);
                        }
                        else {
                            newPrefix = addCustomNamespaceDecl(uri, ele);
                            fNSScope->addOrChangeBinding(newPrefix, uri, fMemoryManager);
                            at->setPrefix(newPrefix);
                        }
                    }
                }
            }
            else if(at->getLocalName() == 0) {
                error(XMLErrs::DOMLevel1Node, at);
            }
        }
    }
}